

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

long NGA_Read_inc(int g_a,int *subscript,long inc)

{
  long lVar1;
  Integer IVar2;
  Integer _ga_lo [7];
  Integer aIStack_58 [8];
  
  lVar1 = pnga_ndim((long)g_a);
  if (0 < lVar1) {
    do {
      aIStack_58[lVar1 + -1] = (long)*subscript + 1;
      subscript = subscript + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  IVar2 = pnga_read_inc((long)g_a,aIStack_58,inc);
  return IVar2;
}

Assistant:

long NGA_Read_inc(int g_a, int subscript[], long inc)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer in=(Integer)inc;
    Integer _ga_lo[MAXDIM];
    COPYINDEX_C2F(subscript, _ga_lo, ndim);
    return (long)wnga_read_inc(a, _ga_lo, in);
}